

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_InitConstProperty(Var obj,PropertyId propertyId,Var newValue)

{
  bool bVar1;
  uint uVar2;
  RecyclableObject *this;
  ScriptContext *this_00;
  byte local_2d;
  PropertyAttributes attributes;
  PropertyOperationFlags flags;
  RecyclableObject *instance;
  Var newValue_local;
  PropertyId propertyId_local;
  Var obj_local;
  
  this = VarTo<Js::RecyclableObject>(obj);
  this_00 = RecyclableObject::GetScriptContext(this);
  bVar1 = ScriptContext::IsUndeclBlockVar(this_00,newValue);
  uVar2 = 0;
  if (bVar1) {
    uVar2 = 0x10;
  }
  local_2d = 0x83;
  bVar1 = VarIs<Js::RootObjectBase,Js::RecyclableObject>(this);
  if (bVar1) {
    local_2d = 0x93;
  }
  (*(this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (this,(ulong)(uint)propertyId,newValue,(ulong)local_2d,0,(ulong)(uVar2 | 0x80),0xf);
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_InitConstProperty(Var obj, PropertyId propertyId, Var newValue)
    {
        RecyclableObject* instance = VarTo<RecyclableObject>(obj);
        JIT_HELPER_REENTRANT_HEADER(Op_InitConstFld);

        PropertyOperationFlags flags = instance->GetScriptContext()->IsUndeclBlockVar(newValue) ? PropertyOperation_SpecialValue : PropertyOperation_None;
        PropertyAttributes attributes = PropertyConstDefaults;

        if (VarIs<RootObjectBase>(instance))
        {
            attributes |= PropertyLetConstGlobal;
        }

        instance->SetPropertyWithAttributes(propertyId, newValue, attributes, NULL, (PropertyOperationFlags)(flags | PropertyOperation_AllowUndecl));

        return TRUE;
        JIT_HELPER_END(Op_InitConstFld);
    }